

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

void inxbuild(nn_quant *nnq)

{
  nq_pixel *paiVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  int local_3c;
  
  uVar16 = (ulong)(uint)nnq->netsize;
  if (nnq->netsize < 1) {
    iVar5 = 0x7f;
    uVar4 = 0;
  }
  else {
    piVar6 = nnq->network[1] + 2;
    uVar8 = 1;
    local_3c = 0;
    uVar4 = 0;
    uVar10 = 0;
    do {
      uVar2 = nnq->network[uVar10][2];
      uVar11 = uVar10 + 1;
      iVar5 = (int)uVar10;
      uVar14 = uVar10 & 0xffffffff;
      uVar7 = uVar2;
      if ((long)uVar11 < (long)(int)uVar16) {
        uVar14 = uVar10 & 0xffffffff;
        uVar9 = uVar8;
        piVar15 = piVar6;
        do {
          if (*piVar15 < (int)uVar7) {
            uVar14 = uVar9 & 0xffffffff;
            uVar7 = *piVar15;
          }
          uVar9 = uVar9 + 1;
          piVar15 = piVar15 + 5;
        } while ((uVar16 & 0xffffffff) != uVar9);
      }
      iVar13 = (int)uVar14;
      if (uVar10 != uVar14) {
        paiVar1 = nnq->network + uVar10;
        iVar3 = nnq->network[iVar13][0];
        nnq->network[iVar13][0] = (*paiVar1)[0];
        (*paiVar1)[0] = iVar3;
        iVar3 = nnq->network[iVar13][1];
        nnq->network[iVar13][1] = (*paiVar1)[1];
        (*paiVar1)[1] = iVar3;
        iVar3 = nnq->network[iVar13][2];
        nnq->network[iVar13][2] = uVar2;
        (*paiVar1)[2] = iVar3;
        iVar3 = nnq->network[iVar13][3];
        nnq->network[iVar13][3] = (*paiVar1)[3];
        (*paiVar1)[3] = iVar3;
        iVar3 = nnq->network[iVar13][4];
        nnq->network[iVar13][4] = (*paiVar1)[4];
        (*paiVar1)[4] = iVar3;
      }
      uVar2 = uVar4;
      if (uVar7 != uVar4) {
        nnq->netindex[(int)uVar4] = local_3c + iVar5 >> 1;
        uVar2 = uVar7;
        local_3c = iVar5;
        if ((int)(uVar4 + 1) < (int)uVar7) {
          lVar12 = 0;
          do {
            nnq->netindex[(int)(uVar4 + 1) + lVar12] = iVar5;
            lVar12 = lVar12 + 1;
          } while (~uVar4 + uVar7 != (int)lVar12);
        }
      }
      uVar4 = uVar2;
      uVar16 = (ulong)nnq->netsize;
      uVar8 = uVar8 + 1;
      piVar6 = piVar6 + 5;
      uVar10 = uVar11;
    } while ((long)uVar11 < (long)uVar16);
    iVar5 = local_3c + 0xff >> 1;
  }
  lVar12 = (long)(int)uVar4;
  nnq->netindex[lVar12] = iVar5;
  if ((int)uVar4 < 0xff) {
    do {
      nnq->netindex[lVar12 + 1] = 0xff;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xff);
  }
  return;
}

Assistant:

void inxbuild(nn_quant *nnq)
{
	register int i,j,smallpos,smallval;
	register int *p,*q;
	int previouscol,startpos;

	previouscol = 0;
	startpos = 0;
	for (i=0; i < nnq->netsize; i++) {
		p = nnq->network[i];
		smallpos = i;
		smallval = p[2];			/* index on g */
		/* find smallest in i..netsize-1 */
		for (j=i+1; j < nnq->netsize; j++) {
			q = nnq->network[j];
			if (q[2] < smallval) {		/* index on g */
				smallpos = j;
				smallval = q[2];	/* index on g */
			}
		}
		q = nnq->network[smallpos];
		/* swap p (i) and q (smallpos) entries */
		if (i != smallpos) {
			j = q[0];
			q[0] = p[0];
			p[0] = j;
			j = q[1];
			q[1] = p[1];
			p[1] = j;
			j = q[2];
			q[2] = p[2];
			p[2] = j;
			j = q[3];
			q[3] = p[3];
			p[3] = j;
			j = q[4];
			q[4] = p[4];
			p[4] = j;
		}
		/* smallval entry is now in position i */
		if (smallval != previouscol) {
			nnq->netindex[previouscol] = (startpos+i)>>1;
			for (j=previouscol+1; j<smallval; j++) nnq->netindex[j] = i;
			previouscol = smallval;
			startpos = i;
		}
	}
	nnq->netindex[previouscol] = (startpos+maxnetpos)>>1;
	for (j=previouscol+1; j<256; j++) nnq->netindex[j] = maxnetpos; /* really 256 */
}